

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

void icu_63::NFRule::makeRules
               (UnicodeString *description,NFRuleSet *owner,NFRule *predecessor,
               RuleBasedNumberFormat *rbnf,NFRuleList *rules,UErrorCode *status)

{
  ulong uVar1;
  bool bVar2;
  UBool UVar3;
  uint srcLength;
  ERuleType EVar4;
  int32_t iVar5;
  NFRule *pNVar6;
  uint64_t uVar7;
  size_t size;
  NFRule *local_138;
  uint local_114;
  NFRule *local_108;
  UnicodeString local_f8;
  undefined1 local_b1;
  NFRule *local_b0;
  undefined1 local_a8 [8];
  UnicodeString sbuf;
  NFRule *rule2;
  int32_t brack2;
  int32_t brack1;
  NFRule *rule1;
  UErrorCode *status_local;
  NFRuleList *rules_local;
  RuleBasedNumberFormat *rbnf_local;
  NFRule *predecessor_local;
  NFRuleSet *owner_local;
  UnicodeString *description_local;
  
  pNVar6 = (NFRule *)UMemory::operator_new((UMemory *)0x70,(size_t)owner);
  local_108 = (NFRule *)0x0;
  if (pNVar6 != (NFRule *)0x0) {
    NFRule(pNVar6,rbnf,description,status);
    local_108 = pNVar6;
  }
  if (local_108 == (NFRule *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return;
  }
  UnicodeString::operator=(description,&local_108->fRuleText);
  size = 0x5b;
  srcLength = UnicodeString::indexOf(description,L'[');
  if ((int)srcLength < 0) {
    local_114 = 0xffffffff;
  }
  else {
    size = 0x5d;
    local_114 = UnicodeString::indexOf(description,L']');
  }
  if ((((((int)local_114 < 0) || ((int)local_114 < (int)srcLength)) ||
       (EVar4 = getType(local_108), EVar4 == kProperFractionRule)) ||
      ((EVar4 = getType(local_108), EVar4 == kNegativeNumberRule ||
       (EVar4 = getType(local_108), EVar4 == kInfinityRule)))) ||
     (EVar4 = getType(local_108), EVar4 == kNaNRule)) {
    extractSubstitutions(local_108,owner,description,predecessor,status);
    goto LAB_002c451d;
  }
  sbuf.fUnion._48_8_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)local_a8);
  if (local_108->baseValue < 1) {
LAB_002c40ee:
    EVar4 = getType(local_108);
    if ((EVar4 == kImproperFractionRule) || (EVar4 = getType(local_108), EVar4 == kMasterRule))
    goto LAB_002c412a;
LAB_002c43e6:
    UnicodeString::setTo((UnicodeString *)local_a8,description,0,srcLength);
    UnicodeString::append
              ((UnicodeString *)local_a8,description,srcLength + 1,~srcLength + local_114);
    iVar5 = UnicodeString::length(description);
    if ((int)(local_114 + 1) < iVar5) {
      iVar5 = UnicodeString::length(description);
      UnicodeString::append((UnicodeString *)local_a8,description,local_114 + 1,~local_114 + iVar5);
    }
    extractSubstitutions(local_108,owner,(UnicodeString *)local_a8,predecessor,status);
    if (sbuf.fUnion._48_8_ != 0) {
      if (*(long *)sbuf.fUnion._48_8_ < 0) {
        NFRuleSet::setNonNumericalRule(owner,(NFRule *)sbuf.fUnion._48_8_);
      }
      else {
        NFRuleList::add(rules,(NFRule *)sbuf.fUnion._48_8_);
      }
    }
    bVar2 = false;
  }
  else {
    uVar1 = local_108->baseValue;
    size = (size_t)(ushort)local_108->exponent;
    uVar7 = util64_pow(local_108->radix,local_108->exponent);
    if (uVar1 % uVar7 != 0) goto LAB_002c40ee;
LAB_002c412a:
    pNVar6 = (NFRule *)UMemory::operator_new((UMemory *)0x70,size);
    local_138 = (NFRule *)0x0;
    if (pNVar6 != (NFRule *)0x0) {
      local_b1 = 1;
      local_b0 = pNVar6;
      UnicodeString::UnicodeString(&local_f8);
      NFRule(pNVar6,rbnf,&local_f8,status);
      local_138 = pNVar6;
    }
    local_b1 = 0;
    sbuf.fUnion._48_8_ = local_138;
    if (pNVar6 != (NFRule *)0x0) {
      UnicodeString::~UnicodeString(&local_f8);
    }
    if (sbuf.fUnion._48_8_ != 0) {
      if (local_108->baseValue < 0) {
        EVar4 = getType(local_108);
        if (EVar4 == kImproperFractionRule) {
          setType((NFRule *)sbuf.fUnion._48_8_,kProperFractionRule);
        }
        else {
          EVar4 = getType(local_108);
          if (EVar4 == kMasterRule) {
            *(int64_t *)sbuf.fUnion._48_8_ = local_108->baseValue;
            setType(local_108,kImproperFractionRule);
          }
        }
      }
      else {
        *(int64_t *)sbuf.fUnion._48_8_ = local_108->baseValue;
        UVar3 = NFRuleSet::isFractionRuleSet(owner);
        if (UVar3 == '\0') {
          local_108->baseValue = local_108->baseValue + 1;
        }
      }
      *(int32_t *)(sbuf.fUnion._48_8_ + 8) = local_108->radix;
      *(int16_t *)(sbuf.fUnion._48_8_ + 0xc) = local_108->exponent;
      UnicodeString::append((UnicodeString *)local_a8,description,0,srcLength);
      iVar5 = UnicodeString::length(description);
      if ((int)(local_114 + 1) < iVar5) {
        iVar5 = UnicodeString::length(description);
        UnicodeString::append
                  ((UnicodeString *)local_a8,description,local_114 + 1,~local_114 + iVar5);
      }
      extractSubstitutions
                ((NFRule *)sbuf.fUnion._48_8_,owner,(UnicodeString *)local_a8,predecessor,status);
      goto LAB_002c43e6;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
    bVar2 = true;
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_a8);
  if (bVar2) {
    return;
  }
LAB_002c451d:
  if (local_108->baseValue < 0) {
    NFRuleSet::setNonNumericalRule(owner,local_108);
  }
  else {
    NFRuleList::add(rules,local_108);
  }
  return;
}

Assistant:

void
NFRule::makeRules(UnicodeString& description,
                  NFRuleSet *owner,
                  const NFRule *predecessor,
                  const RuleBasedNumberFormat *rbnf,
                  NFRuleList& rules,
                  UErrorCode& status)
{
    // we know we're making at least one rule, so go ahead and
    // new it up and initialize its basevalue and divisor
    // (this also strips the rule descriptor, if any, off the
    // descripton string)
    NFRule* rule1 = new NFRule(rbnf, description, status);
    /* test for NULL */
    if (rule1 == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    description = rule1->fRuleText;

    // check the description to see whether there's text enclosed
    // in brackets
    int32_t brack1 = description.indexOf(gLeftBracket);
    int32_t brack2 = brack1 < 0 ? -1 : description.indexOf(gRightBracket);

    // if the description doesn't contain a matched pair of brackets,
    // or if it's of a type that doesn't recognize bracketed text,
    // then leave the description alone, initialize the rule's
    // rule text and substitutions, and return that rule
    if (brack2 < 0 || brack1 > brack2
        || rule1->getType() == kProperFractionRule
        || rule1->getType() == kNegativeNumberRule
        || rule1->getType() == kInfinityRule
        || rule1->getType() == kNaNRule)
    {
        rule1->extractSubstitutions(owner, description, predecessor, status);
    }
    else {
        // if the description does contain a matched pair of brackets,
        // then it's really shorthand for two rules (with one exception)
        NFRule* rule2 = NULL;
        UnicodeString sbuf;

        // we'll actually only split the rule into two rules if its
        // base value is an even multiple of its divisor (or it's one
        // of the special rules)
        if ((rule1->baseValue > 0
            && (rule1->baseValue % util64_pow(rule1->radix, rule1->exponent)) == 0)
            || rule1->getType() == kImproperFractionRule
            || rule1->getType() == kMasterRule) {

            // if it passes that test, new up the second rule.  If the
            // rule set both rules will belong to is a fraction rule
            // set, they both have the same base value; otherwise,
            // increment the original rule's base value ("rule1" actually
            // goes SECOND in the rule set's rule list)
            rule2 = new NFRule(rbnf, UnicodeString(), status);
            /* test for NULL */
            if (rule2 == 0) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            if (rule1->baseValue >= 0) {
                rule2->baseValue = rule1->baseValue;
                if (!owner->isFractionRuleSet()) {
                    ++rule1->baseValue;
                }
            }

            // if the description began with "x.x" and contains bracketed
            // text, it describes both the improper fraction rule and
            // the proper fraction rule
            else if (rule1->getType() == kImproperFractionRule) {
                rule2->setType(kProperFractionRule);
            }

            // if the description began with "x.0" and contains bracketed
            // text, it describes both the master rule and the
            // improper fraction rule
            else if (rule1->getType() == kMasterRule) {
                rule2->baseValue = rule1->baseValue;
                rule1->setType(kImproperFractionRule);
            }

            // both rules have the same radix and exponent (i.e., the
            // same divisor)
            rule2->radix = rule1->radix;
            rule2->exponent = rule1->exponent;

            // rule2's rule text omits the stuff in brackets: initalize
            // its rule text and substitutions accordingly
            sbuf.append(description, 0, brack1);
            if (brack2 + 1 < description.length()) {
                sbuf.append(description, brack2 + 1, description.length() - brack2 - 1);
            }
            rule2->extractSubstitutions(owner, sbuf, predecessor, status);
        }

        // rule1's text includes the text in the brackets but omits
        // the brackets themselves: initialize _its_ rule text and
        // substitutions accordingly
        sbuf.setTo(description, 0, brack1);
        sbuf.append(description, brack1 + 1, brack2 - brack1 - 1);
        if (brack2 + 1 < description.length()) {
            sbuf.append(description, brack2 + 1, description.length() - brack2 - 1);
        }
        rule1->extractSubstitutions(owner, sbuf, predecessor, status);

        // if we only have one rule, return it; if we have two, return
        // a two-element array containing them (notice that rule2 goes
        // BEFORE rule1 in the list: in all cases, rule2 OMITS the
        // material in the brackets and rule1 INCLUDES the material
        // in the brackets)
        if (rule2 != NULL) {
            if (rule2->baseValue >= kNoBase) {
                rules.add(rule2);
            }
            else {
                owner->setNonNumericalRule(rule2);
            }
        }
    }
    if (rule1->baseValue >= kNoBase) {
        rules.add(rule1);
    }
    else {
        owner->setNonNumericalRule(rule1);
    }
}